

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_AmrMesh.cpp
# Opt level: O3

void __thiscall amrex::AmrMesh::AmrMesh(AmrMesh *this)

{
  pointer piVar1;
  Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> local_58;
  Vector<int,_std::allocator<int>_> local_40;
  
  AmrInfo::AmrInfo(&this->super_AmrInfo);
  this->_vptr_AmrMesh = (_func_int **)&PTR__AmrMesh_0080da48;
  (this->geom).super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
  super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->geom).super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
  super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->geom).super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
  super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->dmap).super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
  .super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->dmap).super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
  .super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->dmap).super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
  .super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->grids).super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
  super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->grids).super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
  super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->grids).super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
  super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->num_setdm = 0;
  this->num_setba = 0;
  Geometry::Setup((RealBox *)0x0,-1,(int *)0x0);
  piVar1 = (pointer)operator_new(0xc);
  local_40.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
  _M_impl.super__Vector_impl_data._M_finish = piVar1 + 3;
  piVar1[2] = -1;
  piVar1[0] = -1;
  piVar1[1] = -1;
  local_58.super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
  super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
  super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
  super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_40.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
  _M_impl.super__Vector_impl_data._M_start = piVar1;
  local_40.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       local_40.super_vector<int,_std::allocator<int>_>.
       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish;
  InitAmrMesh(this,-1,&local_40,&local_58,(RealBox *)0x0,-1,(int *)0x0);
  operator_delete(piVar1,0xc);
  return;
}

Assistant:

AmrMesh::AmrMesh ()
{
    Geometry::Setup();
    int max_level_in = -1;
    Vector<int> n_cell_in(AMREX_SPACEDIM, -1);
    InitAmrMesh(max_level_in,n_cell_in);
}